

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedSwitchBuffers::Setup(AdvancedSwitchBuffers *this)

{
  AdvancedSwitchBuffers *this_local;
  
  this->m_program = 0;
  memset(this->m_storage_buffer,0,0x14);
  this->m_vertex_array = 0;
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_fbo);
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_rt);
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_program = 0;
		memset(m_storage_buffer, 0, sizeof(m_storage_buffer));
		m_vertex_array = 0;
		glGenFramebuffers(1, &m_fbo);
		glGenTextures(1, &m_rt);
		return NO_ERROR;
	}